

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68000_dbcc(m68k_info *info)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  uVar1 = 0xaaaa;
  if (uVar2 + 2 <= info->code_len) {
    uVar1 = (uint)(ushort)(*(ushort *)(info->code + uVar2) << 8 |
                          *(ushort *)(info->code + uVar2) >> 8);
  }
  info->pc = info->pc + 2;
  build_dbxx(info,*(int *)((long)s_dbcc_lut + (ulong)(info->ir >> 6 & 0x3c)),
             (int)(short)uVar1 & 0xffff0000U | uVar1,0x583d30);
  return;
}

Assistant:

static unsigned int peek_imm_16(const m68k_info *info) { return m68k_read_safe_16((info), (info)->pc); }